

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsModule.cpp
# Opt level: O2

AsmJsSymbol * __thiscall
Js::AsmJsModuleCompiler::LookupIdentifier
          (AsmJsModuleCompiler *this,PropertyName name,AsmJsFunc *func,Source *lookupSource)

{
  AsmJsSymbol *pAVar1;
  AsmJsSymbol **ppAVar2;
  AsmJsSymbol *local_30;
  PropertyId local_24;
  
  if (name == (PropertyName)0x0) {
    return (AsmJsSymbol *)0x0;
  }
  if ((func != (AsmJsFunc *)0x0) &&
     (pAVar1 = AsmJsFunc::LookupIdentifier(func,name,lookupSource), pAVar1 != (AsmJsSymbol *)0x0)) {
    return pAVar1;
  }
  local_24 = name->m_propertyId;
  local_30 = (AsmJsSymbol *)0x0;
  ppAVar2 = JsUtil::
            BaseDictionary<int,_Js::AsmJsSymbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::LookupWithKey<int>(&this->mModuleEnvironment,&local_24,&local_30);
  pAVar1 = *ppAVar2;
  if (lookupSource != (Source *)0x0) {
    *lookupSource = AsmJsModule;
  }
  return pAVar1;
}

Assistant:

AsmJsSymbol* AsmJsModuleCompiler::LookupIdentifier(PropertyName name, AsmJsFunc* func /*= nullptr */, AsmJsLookupSource::Source* lookupSource /*= nullptr*/)
    {
        AsmJsSymbol* lookupResult = nullptr;
        if (name)
        {
            if (func)
            {
                lookupResult = func->LookupIdentifier(name, lookupSource);
                if (lookupResult)
                {
                    return lookupResult;
                }
            }

            lookupResult = mModuleEnvironment.LookupWithKey(name->GetPropertyId(), nullptr);
            if (lookupSource)
            {
                *lookupSource = AsmJsLookupSource::AsmJsModule;
            }
        }
        return lookupResult;
    }